

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vwdll.cpp
# Opt level: O0

size_t VW_HashSpaceA(VW_HANDLE handle,char *s)

{
  uint64_t uVar1;
  char *in_RSI;
  string str;
  vw *pointer;
  string local_70 [8];
  string *in_stack_ffffffffffffff98;
  vw *in_stack_ffffffffffffffa0;
  allocator local_39;
  string local_38 [56];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,in_RSI,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::__cxx11::string::string(local_70,local_38);
  uVar1 = VW::hash_space(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_38);
  return uVar1;
}

Assistant:

VW_DLL_MEMBER size_t VW_CALLING_CONV VW_HashSpaceA(VW_HANDLE handle, const char * s)
{ vw * pointer = static_cast<vw*>(handle);
  string str(s);
  return VW::hash_space(*pointer, str);
}